

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  bool bVar1;
  int iVar2;
  RunContext *this_00;
  pointer pIVar3;
  Totals *_stdErr;
  element_type *peVar4;
  undefined4 extraout_var;
  RunContext *in_RDX;
  long in_RSI;
  TestCaseStats *in_RDI;
  ITracker *rootTracker;
  TestCaseInfo *testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  RunContext *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdad;
  byte in_stack_fffffffffffffdae;
  byte in_stack_fffffffffffffdaf;
  SectionTracker *in_stack_fffffffffffffdb0;
  undefined1 _aborting;
  Totals *_totals;
  TestCaseStats *this_01;
  undefined1 local_208 [48];
  NameAndLocation *in_stack_fffffffffffffe28;
  TrackerContext *in_stack_fffffffffffffe30;
  TrackerContext *in_stack_fffffffffffffe40;
  string local_88 [32];
  string local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  string *redirectedCerr_00;
  string *redirectedCout_00;
  string *_stdOut;
  
  redirectedCout_00 = *(string **)(in_RSI + 0x120);
  local_48 = *(undefined8 *)(in_RSI + 0xf0);
  uStack_40 = *(undefined8 *)(in_RSI + 0xf8);
  local_38 = *(undefined8 *)(in_RSI + 0x100);
  uStack_30 = *(undefined8 *)(in_RSI + 0x108);
  local_28 = *(undefined8 *)(in_RSI + 0x110);
  redirectedCerr_00 = *(string **)(in_RSI + 0x118);
  this_01 = in_RDI;
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  this_00 = (RunContext *)TestCase::getTestCaseInfo((TestCase *)in_RDX);
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x130d56);
  (*pIVar3->_vptr_IStreamingReporter[7])(pIVar3,this_00);
  *(RunContext **)(in_RSI + 0x38) = in_RDX;
  _stdErr = (Totals *)TestCaseTracking::TrackerContext::startRun(in_stack_fffffffffffffe40);
  _totals = _stdErr;
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x130dbb);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x13])();
  _stdOut = (string *)CONCAT44(extraout_var,iVar2);
  TestCaseTracking::SectionTracker::addInitialFilters
            ((SectionTracker *)this_01,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
  do {
    TestCaseTracking::TrackerContext::startCycle((TrackerContext *)in_stack_fffffffffffffda0);
    _aborting = (undefined1)((ulong)(in_RSI + 0x1c8) >> 0x38);
    TestCaseTracking::NameAndLocation::NameAndLocation
              ((NameAndLocation *)in_stack_fffffffffffffdb0,
               (string *)
               CONCAT17(in_stack_fffffffffffffdaf,
                        CONCAT16(in_stack_fffffffffffffdae,
                                 CONCAT15(in_stack_fffffffffffffdad,
                                          CONCAT14(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8)))),
               (SourceLineInfo *)in_stack_fffffffffffffda0);
    in_stack_fffffffffffffdb0 =
         TestCaseTracking::SectionTracker::acquire
                   (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    *(SectionTracker **)(in_RSI + 0x40) = in_stack_fffffffffffffdb0;
    TestCaseTracking::NameAndLocation::~NameAndLocation((NameAndLocation *)0x130e5c);
    runCurrentTest(in_RDX,redirectedCout_00,redirectedCerr_00);
    in_stack_fffffffffffffdaf = (**(code **)(**(long **)(in_RSI + 0x40) + 0x18))();
    in_stack_fffffffffffffdae = 0;
    if ((in_stack_fffffffffffffdaf & 1) == 0) {
      in_stack_fffffffffffffdad = aborting(in_stack_fffffffffffffda0);
      in_stack_fffffffffffffdae = in_stack_fffffffffffffdad ^ 0xff;
    }
  } while ((in_stack_fffffffffffffdae & 1) != 0);
  Totals::delta((Totals *)in_stack_fffffffffffffdb0,
                (Totals *)
                CONCAT17(in_stack_fffffffffffffdaf,
                         CONCAT16(in_stack_fffffffffffffdae,
                                  CONCAT15(in_stack_fffffffffffffdad,
                                           CONCAT14(in_stack_fffffffffffffdac,
                                                    in_stack_fffffffffffffda8)))));
  bVar1 = TestCaseInfo::expectedToFail((TestCaseInfo *)this_00);
  if ((bVar1) && (*(long *)((long)&(in_RDI->testInfo).name.field_2 + 8) != 0)) {
    (in_RDI->testInfo).name._M_string_length =
         (size_type)&((pointer)(in_RDI->testInfo).name._M_string_length)->field_0x1;
    *(long *)((long)&(in_RDI->testInfo).name.field_2 + 8) =
         *(long *)((long)&(in_RDI->testInfo).name.field_2 + 8) + -1;
    *(long *)&(in_RDI->testInfo).className = *(long *)&(in_RDI->testInfo).className + 1;
  }
  Counts::operator+=((Counts *)(in_RSI + 0x110),
                     (Counts *)((long)&(in_RDI->testInfo).name.field_2 + 8));
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x130fa9);
  aborting(this_00);
  TestCaseStats::TestCaseStats
            (this_01,(TestCaseInfo *)in_RDI,_totals,_stdOut,(string *)_stdErr,(bool)_aborting);
  (*pIVar3->_vptr_IStreamingReporter[0xc])(pIVar3,local_208);
  TestCaseStats::~TestCaseStats((TestCaseStats *)this_00);
  *(undefined8 *)(in_RSI + 0x38) = 0;
  *(undefined8 *)(in_RSI + 0x40) = 0;
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  return (Totals *)this_01;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }